

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O3

RealCanvas<plot::BrailleCanvas> * __thiscall
plot::RealCanvas<plot::BrailleCanvas>::
path<__gnu_cxx::__normal_iterator<plot::GenericPoint<float>*,std::vector<plot::GenericPoint<float>,std::allocator<plot::GenericPoint<float>>>>>
          (RealCanvas<plot::BrailleCanvas> *this,Color *color,
          __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
          first,__normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
                last)

{
  Pointf to;
  Pointf *pPVar1;
  GenericPoint<float> from;
  
  BrailleCanvas::push(&this->canvas_);
  pPVar1 = first._M_current + 1;
  if (pPVar1 != last._M_current) {
    from = *first._M_current;
    do {
      to = *pPVar1;
      line<>(this,color,from,to);
      pPVar1 = pPVar1 + 1;
      from = to;
    } while (pPVar1 != last._M_current);
  }
  BrailleCanvas::pop(&this->canvas_,Over);
  return this;
}

Assistant:

RealCanvas& path(Color const& color, Iterator first, Iterator last, Args&&... args) {
        push();
        auto start = *first;
        while (++first != last) {
            auto end = *first;
            line(color, start, end);
            start = end;
        }
        return pop(std::forward<Args>(args)...);
    }